

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_nodes.h
# Opt level: O2

void __thiscall spvtools::opt::SEAddNode::~SEAddNode(SEAddNode *this)

{
  SENode::~SENode(&this->super_SENode);
  operator_delete(this,0x30);
  return;
}

Assistant:

explicit SEAddNode(ScalarEvolutionAnalysis* parent_analysis)
      : SENode(parent_analysis) {}